

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::InstDebugPrintfPass::GetStreamWriteFunctionId
          (InstDebugPrintfPass *this,uint32_t param_cnt)

{
  uint uVar1;
  long *plVar2;
  IRContext *this_00;
  undefined1 auVar3 [8];
  _Alloc_hider _Var4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t operand1;
  mapped_type *pmVar10;
  TypeManager *this_01;
  Type *pTVar11;
  Instruction *pIVar12;
  Instruction *this_02;
  ulong uVar13;
  uint32_t value;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_03;
  uint32_t param_cnt_local;
  unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> output_func;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_blk_ptr
  ;
  undefined1 local_120 [8];
  undefined1 local_118 [8];
  undefined1 local_110 [24];
  vector<unsigned_int,_std::allocator<unsigned_int>_> param_ids;
  string name;
  __node_base local_c0;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_b8;
  __node_base local_b0;
  InstructionBuilder builder;
  Type *uint_type;
  undefined1 local_80 [32];
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  param_types;
  size_type local_48;
  __node_base _Stack_40;
  __node_base_ptr local_38;
  
  this_03 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)&(this->super_InstrumentPass).param2output_func_id_;
  param_cnt_local = param_cnt;
  pmVar10 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[](this_03,&param_cnt_local);
  if (*pmVar10 == 0) {
    uVar5 = Pass::TakeNextId((Pass *)this);
    pmVar10 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](this_03,&param_cnt_local);
    *pmVar10 = uVar5;
    this_01 = IRContext::get_type_mgr((this->super_InstrumentPass).super_Pass.context_);
    uint_type = &InstrumentPass::GetInteger(&this->super_InstrumentPass,0x20,false)->super_Type;
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::vector(&param_types,(ulong)(param_cnt_local + 2),&uint_type,(allocator_type *)&builder);
    local_110._16_8_ = this_03;
    pmVar10 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](this_03,&param_cnt_local);
    uVar1 = *pmVar10;
    pTVar11 = analysis::TypeManager::GetVoidType(this_01);
    uVar5 = (uint32_t)this;
    InstrumentPass::StartFunction
              ((InstrumentPass *)&output_func,uVar5,(Type *)(ulong)uVar1,
               (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                *)pTVar11);
    InstrumentPass::AddParameters
              (&param_ids,&this->super_InstrumentPass,
               (Function *)
               output_func._M_t.
               super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
               .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl,&param_types);
    Pass::TakeNextId((Pass *)this);
    InstrumentPass::NewLabel((InstrumentPass *)&builder,uVar5);
    MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((spvtools *)&new_blk_ptr,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&builder);
    if (builder.context_ != (IRContext *)0x0) {
      (*(code *)(builder.context_)->syntax_context_->opcode_table)();
    }
    InstructionBuilder::InstructionBuilder
              (&builder,(this->super_InstrumentPass).super_Pass.context_,
               (BasicBlock *)
               new_blk_ptr._M_t.
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
               kAnalysisInstrToBlockMapping|kAnalysisBegin);
    value = param_cnt_local + 3;
    uVar6 = GetOutputBufferId(this);
    uVar7 = GetOutputBufferPtrId(this);
    name._M_dataplus._M_p._0_4_ = InstructionBuilder::GetUintConstantId(&builder,1);
    local_48 = 0;
    _Stack_40._M_nxt = (_Hash_node_base *)0x0;
    local_38 = (__node_base_ptr)0x0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,&name);
    local_110._8_8_ =
         InstructionBuilder::AddAccessChain
                   (&builder,uVar7,uVar6,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    uVar6 = InstructionBuilder::GetUintConstantId(&builder,value);
    uVar7 = InstructionBuilder::GetUintConstantId(&builder,0);
    uVar8 = InstructionBuilder::GetUintConstantId(&builder,4);
    uVar9 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    operand1 = Instruction::result_id((Instruction *)local_110._8_8_);
    pIVar12 = InstructionBuilder::AddQuadOp(&builder,uVar9,OpAtomicIAdd,operand1,uVar8,uVar7,uVar6);
    uVar6 = Instruction::result_id(pIVar12);
    uVar7 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    uVar8 = InstructionBuilder::GetUintConstantId(&builder,value);
    pIVar12 = InstructionBuilder::AddIAdd(&builder,uVar7,uVar6,uVar8);
    uVar7 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    uVar8 = GetOutputBufferId(this);
    this_02 = InstructionBuilder::AddIdLiteralOp(&builder,uVar7,OpArrayLength,uVar8,2);
    uVar7 = InstrumentPass::GetBoolId(&this->super_InstrumentPass);
    uVar8 = Instruction::result_id(pIVar12);
    uVar9 = Instruction::result_id(this_02);
    pIVar12 = InstructionBuilder::AddBinaryOp(&builder,uVar7,OpULessThanEqual,uVar8,uVar9);
    uVar7 = Pass::TakeNextId((Pass *)this);
    uVar8 = Pass::TakeNextId((Pass *)this);
    InstrumentPass::NewLabel((InstrumentPass *)local_110,uVar5);
    InstrumentPass::NewLabel((InstrumentPass *)local_118,uVar5);
    uVar9 = Instruction::result_id(pIVar12);
    InstructionBuilder::AddConditionalBranch(&builder,uVar9,uVar8,uVar7,uVar7,0);
    local_b0._M_nxt =
         (_Hash_node_base *)
         new_blk_ptr._M_t.
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    new_blk_ptr._M_t.
    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
          )(__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            )0x0;
    Function::AddBasicBlock
              ((Function *)
               output_func._M_t.
               super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
               .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl,
               (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                *)&local_b0);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&local_b0);
    MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((spvtools *)&name,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)local_118);
    _Var4 = name._M_dataplus;
    name._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             *)&new_blk_ptr,(pointer)_Var4._M_p);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&name);
    builder.parent_ =
         (BasicBlock *)
         new_blk_ptr._M_t.
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    builder.insert_before_.super_iterator.node_ =
         (iterator)
         ((long)new_blk_ptr._M_t.
                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x18);
    uVar8 = InstructionBuilder::GetUintConstantId(&builder,value);
    GenDebugOutputFieldCode(this,uVar6,0,uVar8,&builder);
    GenDebugOutputFieldCode
              (this,uVar6,1,
               *param_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,&builder);
    GenDebugOutputFieldCode
              (this,uVar6,2,
               param_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1],&builder);
    uVar13 = 2;
    while (uVar13 - 2 < (ulong)param_cnt_local) {
      GenDebugOutputFieldCode
                (this,uVar6,(uint32_t)(uVar13 + 1),
                 param_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13 & 0xffffffff],&builder);
      uVar13 = uVar13 + 1;
    }
    InstructionBuilder::AddBranch(&builder,uVar7);
    local_b8 = (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                )(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  )new_blk_ptr._M_t.
                   super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    new_blk_ptr._M_t.
    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
          )(__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            )0x0;
    Function::AddBasicBlock
              ((Function *)
               output_func._M_t.
               super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
               .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl,&local_b8);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr(&local_b8);
    MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((spvtools *)&name,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)local_110);
    _Var4 = name._M_dataplus;
    name._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             *)&new_blk_ptr,(pointer)_Var4._M_p);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&name);
    builder.parent_ =
         (BasicBlock *)
         new_blk_ptr._M_t.
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    builder.insert_before_.super_iterator.node_ =
         (iterator)
         ((long)new_blk_ptr._M_t.
                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x18);
    InstructionBuilder::AddNullaryOp(&builder,0,OpReturn);
    local_c0._M_nxt =
         (_Hash_node_base *)
         new_blk_ptr._M_t.
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    new_blk_ptr._M_t.
    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
          )(__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            )0x0;
    Function::AddBasicBlock
              ((Function *)
               output_func._M_t.
               super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
               .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl,
               (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                *)&local_c0);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&local_c0);
    InstrumentPass::EndFunction((InstrumentPass *)local_120);
    auVar3 = local_120;
    local_120 = (undefined1  [8])0x0;
    plVar2 = *(long **)((long)output_func._M_t.
                              super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                              .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl
                       + 0xb0);
    *(undefined1 (*) [8])
     ((long)output_func._M_t.
            super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
            .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl + 0xb0) = auVar3;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
      if (local_120 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_120 + 8))();
      }
    }
    local_120 = (undefined1  [8])0x0;
    IRContext::AddFunction((this->super_InstrumentPass).super_Pass.context_,&output_func);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"stream_write_",(allocator<char> *)local_80);
    std::__cxx11::to_string((string *)local_80,param_cnt_local);
    std::__cxx11::string::append((string *)&name);
    std::__cxx11::string::_M_dispose();
    this_03 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)local_110._16_8_;
    this_00 = (this->super_InstrumentPass).super_Pass.context_;
    pmVar10 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)local_110._16_8_,&param_cnt_local);
    NewGlobalName((InstDebugPrintfPass *)local_80,uVar5,(string *)(ulong)*pmVar10);
    IRContext::AddDebug2Inst
              (this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        *)local_80);
    if ((IRContext *)local_80._0_8_ != (IRContext *)0x0) {
      (**(code **)(*(long *)local_80._0_8_ + 8))();
    }
    std::__cxx11::string::_M_dispose();
    if ((_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)local_118 !=
        (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)0x0) {
      (**(code **)(*(_func_int **)local_118 + 8))();
    }
    if ((IRContext *)local_110._0_8_ != (IRContext *)0x0) {
      (**(code **)(*(long *)local_110._0_8_ + 8))();
    }
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr(&new_blk_ptr);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&param_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    ~unique_ptr(&output_func);
    std::
    _Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::~_Vector_base(&param_types.
                     super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   );
  }
  pmVar10 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[](this_03,&param_cnt_local);
  return *pmVar10;
}

Assistant:

uint32_t InstDebugPrintfPass::GetStreamWriteFunctionId(uint32_t param_cnt) {
  enum {
    kShaderId = 0,
    kInstructionIndex = 1,
    kFirstParam = 2,
  };
  // Total param count is common params plus validation-specific
  // params
  if (param2output_func_id_[param_cnt] == 0) {
    // Create function
    param2output_func_id_[param_cnt] = TakeNextId();
    analysis::TypeManager* type_mgr = context()->get_type_mgr();

    const analysis::Type* uint_type = GetInteger(32, false);

    std::vector<const analysis::Type*> param_types(kFirstParam + param_cnt,
                                                   uint_type);
    std::unique_ptr<Function> output_func = StartFunction(
        param2output_func_id_[param_cnt], type_mgr->GetVoidType(), param_types);

    std::vector<uint32_t> param_ids = AddParameters(*output_func, param_types);

    // Create first block
    auto new_blk_ptr = MakeUnique<BasicBlock>(NewLabel(TakeNextId()));

    InstructionBuilder builder(
        context(), &*new_blk_ptr,
        IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
    // Gen test if debug output buffer size will not be exceeded.
    const uint32_t first_param_offset = kInstCommonOutInstructionIdx + 1;
    const uint32_t obuf_record_sz = first_param_offset + param_cnt;
    const uint32_t buf_id = GetOutputBufferId();
    const uint32_t buf_uint_ptr_id = GetOutputBufferPtrId();
    Instruction* obuf_curr_sz_ac_inst = builder.AddAccessChain(
        buf_uint_ptr_id, buf_id,
        {builder.GetUintConstantId(kDebugOutputSizeOffset)});
    // Fetch the current debug buffer written size atomically, adding the
    // size of the record to be written.
    uint32_t obuf_record_sz_id = builder.GetUintConstantId(obuf_record_sz);
    uint32_t mask_none_id =
        builder.GetUintConstantId(uint32_t(spv::MemoryAccessMask::MaskNone));
    uint32_t scope_invok_id =
        builder.GetUintConstantId(uint32_t(spv::Scope::Invocation));
    Instruction* obuf_curr_sz_inst = builder.AddQuadOp(
        GetUintId(), spv::Op::OpAtomicIAdd, obuf_curr_sz_ac_inst->result_id(),
        scope_invok_id, mask_none_id, obuf_record_sz_id);
    uint32_t obuf_curr_sz_id = obuf_curr_sz_inst->result_id();
    // Compute new written size
    Instruction* obuf_new_sz_inst =
        builder.AddIAdd(GetUintId(), obuf_curr_sz_id,
                        builder.GetUintConstantId(obuf_record_sz));
    // Fetch the data bound
    Instruction* obuf_bnd_inst =
        builder.AddIdLiteralOp(GetUintId(), spv::Op::OpArrayLength,
                               GetOutputBufferId(), kDebugOutputDataOffset);
    // Test that new written size is less than or equal to debug output
    // data bound
    Instruction* obuf_safe_inst = builder.AddBinaryOp(
        GetBoolId(), spv::Op::OpULessThanEqual, obuf_new_sz_inst->result_id(),
        obuf_bnd_inst->result_id());
    uint32_t merge_blk_id = TakeNextId();
    uint32_t write_blk_id = TakeNextId();
    std::unique_ptr<Instruction> merge_label(NewLabel(merge_blk_id));
    std::unique_ptr<Instruction> write_label(NewLabel(write_blk_id));
    (void)builder.AddConditionalBranch(
        obuf_safe_inst->result_id(), write_blk_id, merge_blk_id, merge_blk_id,
        uint32_t(spv::SelectionControlMask::MaskNone));
    // Close safety test block and gen write block
    output_func->AddBasicBlock(std::move(new_blk_ptr));
    new_blk_ptr = MakeUnique<BasicBlock>(std::move(write_label));
    builder.SetInsertPoint(&*new_blk_ptr);
    // Generate common and stage-specific debug record members
    GenDebugOutputFieldCode(obuf_curr_sz_id, kInstCommonOutSize,
                            builder.GetUintConstantId(obuf_record_sz),
                            &builder);
    // Store Shader Id
    GenDebugOutputFieldCode(obuf_curr_sz_id, kInstCommonOutShaderId,
                            param_ids[kShaderId], &builder);
    // Store Instruction Idx
    GenDebugOutputFieldCode(obuf_curr_sz_id, kInstCommonOutInstructionIdx,
                            param_ids[kInstructionIndex], &builder);
    // Gen writes of validation specific data
    for (uint32_t i = 0; i < param_cnt; ++i) {
      GenDebugOutputFieldCode(obuf_curr_sz_id, first_param_offset + i,
                              param_ids[kFirstParam + i], &builder);
    }
    // Close write block and gen merge block
    (void)builder.AddBranch(merge_blk_id);
    output_func->AddBasicBlock(std::move(new_blk_ptr));
    new_blk_ptr = MakeUnique<BasicBlock>(std::move(merge_label));
    builder.SetInsertPoint(&*new_blk_ptr);
    // Close merge block and function and add function to module
    (void)builder.AddNullaryOp(0, spv::Op::OpReturn);

    output_func->AddBasicBlock(std::move(new_blk_ptr));
    output_func->SetFunctionEnd(EndFunction());
    context()->AddFunction(std::move(output_func));

    std::string name("stream_write_");
    name += std::to_string(param_cnt);

    context()->AddDebug2Inst(
        NewGlobalName(param2output_func_id_[param_cnt], name));
  }
  return param2output_func_id_[param_cnt];
}